

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O1

bool NormaliseTrack(CylHead *cylhead,Track *track)

{
  int *piVar1;
  uint8_t *buf;
  pointer puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Sector *pSVar7;
  Sector *pSVar8;
  Data *pDVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar10;
  long lVar11;
  _Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
  *this;
  _Base_ptr p_Var12;
  _Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
  *p_Var13;
  _Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
  *p_Var14;
  ulong uVar15;
  uint uVar16;
  Sector *s;
  OPTIONS *this_00;
  char *pcsz_;
  MsgType type;
  uint uVar17;
  uint uVar18;
  _Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
  *p_Var19;
  _Base_ptr p_Var20;
  uint index;
  OPTIONS *pOVar21;
  Track *__range2;
  int weak_offset;
  int gap3;
  int weak_size;
  pair<int,_unsigned_char> key;
  Data fill8;
  string str_method;
  int local_18c;
  undefined1 local_188 [8];
  _Base_ptr p_Stack_180;
  _Base_ptr local_178;
  _Base_ptr local_170;
  size_t local_160;
  int local_154;
  OPTIONS *local_150;
  char *local_148;
  key_type local_140;
  undefined1 local_138 [8];
  pointer puStack_130;
  _Base_ptr local_128;
  _Base_ptr p_Stack_120;
  _Base_ptr local_118;
  size_t sStack_110;
  string local_108;
  char *local_e8;
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  local_e0;
  Track local_b0;
  vector<Data,_std::allocator<Data>_> local_88;
  Track local_70;
  vector<Data,_std::allocator<Data>_> local_48;
  
  if (opt.offsets == 0) {
    track->tracklen = 0;
  }
  local_150 = (OPTIONS *)cylhead;
  iVar5 = Track::size(track);
  uVar16 = 0;
  if (iVar5 < 1) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      pSVar7 = Track::operator[](track,uVar16);
      if (opt.nodups != 0) {
        index = uVar16 + 1;
        iVar5 = Track::size(track);
        uVar17 = uVar16;
        if ((int)index < iVar5) {
          do {
            pSVar8 = Track::operator[](track,index);
            bVar3 = Header::compare_chrn(&pSVar8->header,&pSVar7->header);
            uVar18 = index;
            if ((bVar3) && (pSVar8->encoding == pSVar7->encoding)) {
              Track::remove(&local_70,(char *)track);
              std::vector<Data,_std::allocator<Data>_>::~vector(&local_48);
              bVar4 = true;
              uVar18 = uVar17;
            }
            index = uVar18 + 1;
            iVar5 = Track::size(track);
            uVar17 = uVar18;
          } while ((int)index < iVar5);
        }
      }
      if ((opt.nodata != 0) && (bVar3 = Sector::has_data(pSVar7), bVar3)) {
        Sector::remove_data(pSVar7);
        local_188 = (undefined1  [8])0x0;
        p_Stack_180 = (_Base_ptr)0x0;
        local_178 = (_Base_ptr)0x0;
        Sector::add(pSVar7,(Data *)local_188,false,0xfb);
        if (local_188 != (undefined1  [8])0x0) {
          operator_delete((void *)local_188,(long)local_178 - (long)local_188);
        }
        bVar4 = true;
      }
      if (opt.offsets == 0) {
        pSVar7->offset = 0;
      }
      bVar3 = Sector::has_gapdata(pSVar7);
      if (bVar3) {
        if ((opt.gaps == 0) || (((uint)opt.gapmask >> (uVar16 & 0x1f) & 1) == 0)) {
          Sector::remove_gapdata(pSVar7,false);
          bVar4 = true;
        }
        else if ((opt.gaps == 1) && (pSVar7->encoding == MFM)) {
          local_188 = (undefined1  [8])((ulong)local_188 & 0xffffffff00000000);
          pDVar9 = Sector::data_copy(pSVar7,0);
          iVar5 = Sector::size(pSVar7);
          bVar3 = test_remove_gap3(pDVar9,iVar5,(int *)local_188);
          if (bVar3) {
            Sector::remove_gapdata(pSVar7,true);
            bVar4 = true;
            if (pSVar7->gap3 == 0) {
              pSVar7->gap3 = local_188._0_4_;
            }
          }
        }
      }
      uVar16 = uVar16 + 1;
      iVar5 = Track::size(track);
    } while ((int)uVar16 < iVar5);
  }
  iVar5 = Track::size(track);
  pOVar21 = local_150;
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      pSVar7 = Track::operator[](track,iVar5);
      iVar6 = Track::size(track);
      if (((iVar5 == iVar6 + -1) && (opt.gap4b == 0)) &&
         (bVar3 = Sector::has_gapdata(pSVar7), bVar3)) {
        Sector::remove_gapdata(pSVar7,true);
        bVar4 = true;
      }
      if (opt.datarate != Unknown) {
        pSVar7->datarate = opt.datarate;
        bVar4 = true;
      }
      if (opt.encoding != Unknown) {
        pSVar7->encoding = opt.encoding;
        bVar4 = true;
      }
      if (opt.gap3 != -1) {
        pSVar7->gap3 = opt.gap3 & 0xff;
      }
      iVar5 = iVar5 + 1;
      iVar6 = Track::size(track);
    } while (iVar5 < iVar6);
  }
  if (((opt.fix != 0) && (((Header *)&pOVar21->range)->cyl == 0)) &&
     (iVar5 = Track::size(track), iVar5 == 9)) {
    pSVar7 = Track::operator[](track,1);
    iVar5 = Sector::copies(pSVar7);
    if ((iVar5 == 1) && (bVar3 = IsSpectrumSpeedlockTrack(track,&local_18c,&local_154), bVar3)) {
      if (opt.fix == 1) {
        pvVar10 = &Sector::data_copy(pSVar7,0)->
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188,pvVar10);
        lVar11 = (long)local_18c;
        if (local_18c < (int)((_Rb_tree_color)p_Stack_180 - local_188._0_4_)) {
          do {
            *(byte *)((long)local_188 + lVar11) = ~*(byte *)((long)local_188 + lVar11);
            lVar11 = lVar11 + 1;
          } while (lVar11 < (int)((_Rb_tree_color)p_Stack_180 - local_188._0_4_));
        }
        Sector::add(pSVar7,(Data *)local_188,true,0xfb);
        Message<>(msgFix,"added suitable second copy of +3 Speedlock weak sector");
        if (local_188 != (undefined1  [8])0x0) {
          operator_delete((void *)local_188,(long)local_178 - (long)local_188);
        }
        bVar4 = true;
      }
      else {
        Message<>(msgWarning,"missing multiple copies of +3 Speedlock weak sector");
      }
    }
    pSVar7 = Track::operator[](track,7);
    iVar5 = Sector::copies(pSVar7);
    if ((iVar5 == 1) && (bVar3 = IsCpcSpeedlockTrack(track,&local_18c,&local_154), bVar3)) {
      if (opt.fix == 1) {
        pvVar10 = &Sector::data_copy(pSVar7,0)->
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188,pvVar10);
        lVar11 = (long)local_18c;
        if (local_18c < (int)((_Rb_tree_color)p_Stack_180 - local_188._0_4_)) {
          do {
            *(byte *)((long)local_188 + lVar11) = ~*(byte *)((long)local_188 + lVar11);
            lVar11 = lVar11 + 1;
          } while (lVar11 < (int)((_Rb_tree_color)p_Stack_180 - local_188._0_4_));
        }
        Sector::add(pSVar7,(Data *)local_188,true,0xfb);
        Message<>(msgFix,"added suitable second copy of CPC Speedlock weak sector");
        if (local_188 != (undefined1  [8])0x0) {
          operator_delete((void *)local_188,(long)local_178 - (long)local_188);
        }
        bVar4 = true;
      }
      else {
        Message<>(msgWarning,"missing multiple copies of CPC Speedlock weak sector");
      }
    }
  }
  if (((opt.fix != 0) && (((Header *)&pOVar21->range)->cyl == 0x28)) &&
     (iVar5 = Track::size(track), iVar5 == 9)) {
    pSVar7 = Track::operator[](track,1);
    iVar5 = Sector::copies(pSVar7);
    if ((iVar5 == 1) && (bVar3 = IsRainbowArtsTrack(track,&local_18c,&local_154), bVar3)) {
      if (opt.fix == 1) {
        bVar4 = Sector::has_baddatacrc(pSVar7);
        if (!bVar4) {
          pvVar10 = &Sector::data_copy(pSVar7,0)->
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188,pvVar10);
          Sector::remove_data(pSVar7);
          Sector::add(pSVar7,(Data *)local_188,true,0xfb);
          if (opt.debug != 0) {
            util::operator<<((LogHelper *)&util::cout,
                             (char (*) [52])"added missing data CRC error to Rainbow Arts track\n");
          }
          if (local_188 != (undefined1  [8])0x0) {
            operator_delete((void *)local_188,(long)local_178 - (long)local_188);
          }
        }
        pvVar10 = &Sector::data_copy(pSVar7,0)->
                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188,pvVar10);
        lVar11 = (long)local_18c;
        if (local_18c < (int)((_Rb_tree_color)p_Stack_180 - local_188._0_4_)) {
          do {
            *(byte *)((long)local_188 + lVar11) = ~*(byte *)((long)local_188 + lVar11);
            lVar11 = lVar11 + 1;
          } while (lVar11 < (int)((_Rb_tree_color)p_Stack_180 - local_188._0_4_));
        }
        Sector::add(pSVar7,(Data *)local_188,true,0xfb);
        Message<>(msgFix,"added suitable second copy of Rainbow Arts weak sector");
        if (local_188 != (undefined1  [8])0x0) {
          operator_delete((void *)local_188,(long)local_178 - (long)local_188);
        }
        bVar4 = true;
      }
      else {
        Message<>(msgWarning,"missing multiple copies of Rainbow Arts weak sector");
      }
    }
  }
  if (((opt.fix != 0) && (((Header *)&pOVar21->range)->cyl == 0x28)) &&
     (iVar5 = Track::size(track), iVar5 == 9)) {
    pSVar7 = Track::operator[](track,7);
    pSVar8 = Track::operator[](track,8);
    bVar3 = Sector::has_data(pSVar7);
    if (((bVar3) && (iVar5 = Sector::data_size(pSVar8), iVar5 == 0)) &&
       (bVar3 = IsOperaSoftTrack(track), bVar3)) {
      if (opt.fix == 1) {
        pDVar9 = Sector::data_copy(pSVar7,0);
        local_188 = (undefined1  [8])0x0;
        p_Stack_180 = (_Base_ptr)0x0;
        local_178 = (_Base_ptr)0x0;
        local_188 = (undefined1  [8])operator_new(0x100);
        p_Var20 = (_Base_ptr)((long)local_188 + 0x100);
        p_Stack_180 = (_Base_ptr)local_188;
        local_178 = p_Var20;
        memset((void *)local_188,0x55,0x100);
        local_138[0] = 0xe8;
        p_Stack_180 = p_Var20;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188,local_138);
        local_138[0] = 0x9f;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_188,local_138);
        local_108._M_dataplus._M_p._0_1_ = 0x4e;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138,
                   (long)(int)((local_188._0_4_ - (_Rb_tree_color)p_Stack_180) + 0x512),
                   (value_type *)&local_108,(allocator_type *)&local_140);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_188,p_Stack_180,
                   local_138,puStack_130);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_188,p_Stack_180,
                   (pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        Sector::remove_data(pSVar8);
        Sector::add(pSVar8,(Data *)local_188,true,0xfb);
        Message<>(msgFix,"added missing data to OperaSoft 32K sector");
        if (local_138 != (undefined1  [8])0x0) {
          operator_delete((void *)local_138,(long)local_128 - (long)local_138);
        }
        if (local_188 != (undefined1  [8])0x0) {
          operator_delete((void *)local_188,(long)local_178 - (long)local_188);
        }
        bVar4 = true;
      }
      else {
        Message<>(msgWarning,"missing data in OperaSoft 32K sector");
      }
    }
  }
  if (((opt.fix != 0) && (iVar5 = Track::size(track), iVar5 == 0xd)) &&
     ((pSVar7 = Track::operator[](track,6), (pSVar7->header).sector == 0xc &&
      (bVar3 = IsPrehistorikTrack(track), bVar3)))) {
    if (opt.fix == 1) {
      iVar5 = Track::size(track);
      if (7 < iVar5) {
        do {
          Track::remove(&local_b0,(char *)track);
          std::vector<Data,_std::allocator<Data>_>::~vector(&local_88);
          iVar5 = Track::size(track);
        } while (7 < iVar5);
      }
      Message<>(msgFix,"removed unused KBI-19 sectors from end of Prehistorik track");
      bVar4 = true;
    }
    else {
      Message<>(msgWarning,"6 junk KBI-19 sectors found (use --fix to remove)");
    }
  }
  pOVar21 = &opt;
  if ((opt.fix != 0) && (iVar5 = Track::size(track), iVar5 == 10)) {
    pOVar21 = (OPTIONS *)
              (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (this_00 = (OPTIONS *)
                   (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                   super__Vector_impl_data._M_start; this_00 != pOVar21;
        this_00 = (OPTIONS *)&this_00->maxsplice) {
      iVar5 = Sector::size((Sector *)this_00);
      if ((iVar5 == 0x200) && (bVar3 = Sector::has_good_data((Sector *)this_00), bVar3)) {
        pDVar9 = Sector::data_copy((Sector *)this_00,0);
        piVar1 = (int *)(pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
        if (((short)piVar1[1] == 0x4543 && *piVar1 == 0x4e414c00) &&
           (iVar5 = (int)(pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (int)piVar1, 5 < iVar5)) {
          uVar15 = 0;
          do {
            if ((*(char *)((long)piVar1 + uVar15) == -0x23) &&
               (*(char *)((long)piVar1 + uVar15 + 4) == ' ' &&
                *(int *)((long)piVar1 + uVar15) == -0x41ff8123)) {
              if (opt.fix == 1) {
                *(undefined1 *)((long)piVar1 + (uVar15 & 0xffffffff) + 3) = 0xaf;
                type = msgFix;
                pcsz_ = "disabled problematic Reussir protection";
              }
              else {
                type = msgWarning;
                pcsz_ = "detected problematic Reussir protection (use --fix to disable)";
              }
              Message<>(type,pcsz_);
              break;
            }
            uVar15 = uVar15 + 1;
          } while (iVar5 - 5 != uVar15);
        }
      }
    }
  }
  if (opt.check8k == 0) {
    return bVar4;
  }
  bVar3 = Track::is_8k_sector(track);
  if (!bVar3) {
    return bVar4;
  }
  pSVar7 = Track::operator[](track,0);
  iVar5 = Sector::copies(pSVar7);
  if (iVar5 != 1) {
    return bVar4;
  }
  pSVar7 = Track::operator[](track,0);
  iVar5 = Sector::data_size(pSVar7);
  if (iVar5 < 0x1801) {
    return bVar4;
  }
  pSVar7 = Track::operator[](track,0);
  pDVar9 = Sector::data_copy(pSVar7,0);
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&NormaliseTrack::map_mutex);
  if (iVar5 == 0) {
    local_140.first = (pSVar7->header).sector;
    local_140.second = pSVar7->dam;
    pOVar21 = local_150;
    if (NormaliseTrack(CylHead_const&,Track&)::methods_map != '\0') goto LAB_001596ab;
  }
  else {
    std::__throw_system_error(iVar5);
  }
  NormaliseTrack();
LAB_001596ab:
  this = (_Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
          *)std::
            map<std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>,_std::less<std::pair<int,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<int,_unsigned_char>,_std::set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>_>_>_>
            ::operator[](&NormaliseTrack::methods_map,&local_140);
  buf = (pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                  local_188,buf,
                  *(int *)&(pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (int)buf);
  if (*(long *)(this + 0x28) == 0) {
    if (local_160 == 0) {
      local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffff00000000);
      std::
      _Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
      ::_M_assign_unique<ChecksumType_const*>
                (this,(ChecksumType *)local_138,(ChecksumType *)(local_138 + 4));
    }
    else {
      std::
      _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
      ::operator=((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                   *)this,(_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                           *)local_188);
    }
  }
  p_Stack_120 = (_Base_ptr)&puStack_130;
  local_128 = (_Base_ptr)0x0;
  local_138 = (undefined1  [8])0x0;
  puStack_130 = (pointer)0x0;
  sStack_110 = 0;
  p_Var19 = this + 8;
  local_118 = p_Stack_120;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<ChecksumType>,std::_Rb_tree_const_iterator<ChecksumType>,std::insert_iterator<std::set<ChecksumType,std::less<ChecksumType>,std::allocator<ChecksumType>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_170,(_Base_ptr)&p_Stack_180,*(undefined8 *)(this + 0x18),p_Var19,local_138);
  p_Var12 = (_Base_ptr)&p_Stack_180;
  for (p_Var20 = local_178; p_Var20 != (_Base_ptr)0x0;
      p_Var20 = (&p_Var20->_M_left)[p_Var20[1]._M_color >> 0x1f]) {
    if (-1 < (int)p_Var20[1]._M_color) {
      p_Var12 = p_Var20;
    }
  }
  p_Var20 = (_Base_ptr)&p_Stack_180;
  if ((p_Var12 != (_Base_ptr)&p_Stack_180) && (p_Var20 = p_Var12, 0 < (int)p_Var12[1]._M_color)) {
    p_Var20 = (_Base_ptr)&p_Stack_180;
  }
  if (p_Var20 == (_Base_ptr)&p_Stack_180) {
    uVar15 = *(ulong *)(this + 0x28);
    if (sStack_110 == 1) {
      if (1 < uVar15) {
        std::
        _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
        ::operator=((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                     *)this,(_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                             *)local_138);
      }
    }
    else if (uVar15 == 1) {
      if (sStack_110 == 0) {
        p_Var13 = p_Var19;
        for (p_Var14 = *(_Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
                         **)(this + 0x10);
            p_Var14 !=
            (_Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
             *)0x0; p_Var14 = *(_Rb_tree<ChecksumType,ChecksumType,std::_Identity<ChecksumType>,std::less<ChecksumType>,std::allocator<ChecksumType>>
                                **)(p_Var14 + (ulong)(*(uint *)(p_Var14 + 0x20) >> 0x1f) * 8 + 0x10)
            ) {
          if (-1 < (int)*(uint *)(p_Var14 + 0x20)) {
            p_Var13 = p_Var14;
          }
        }
        p_Var14 = p_Var19;
        if ((p_Var13 != p_Var19) && (p_Var14 = p_Var13, 0 < *(int *)(p_Var13 + 0x20))) {
          p_Var14 = p_Var19;
        }
        if (p_Var14 == p_Var19) {
          std::
          _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
          ::_Rb_tree(&local_e0,
                     (_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                      *)this);
          ChecksumName_abi_cxx11_
                    (&local_108,
                     (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_> *)
                     &local_e0);
          std::
          _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
          ::~_Rb_tree(&local_e0);
          uVar16 = *(uint *)(*(long *)(this + 0x18) + 0x20);
          if (((uVar16 < 7 & 0x1cU >> ((byte)uVar16 & 0x1f)) == 0) &&
             (puVar2 = (pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,
             0x1801 < *(int *)&(pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                               .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (int)puVar2)) {
            if ((uVar16 < 7 & 0x62U >> ((byte)uVar16 & 0x1f)) != 0) {
              local_148 = local_108._M_dataplus._M_p;
              local_e8 = CH(((Header *)&pOVar21->range)->cyl,((Header *)&pOVar21->range)->head);
              Message<char_const*,unsigned_char_const&,unsigned_char_const&,char_const*>
                        (msgWarning,"invalid %s checksum [%02X %02X] on %s",&local_148,
                         puVar2 + 0x1800,puVar2 + 0x1801,&local_e8);
            }
          }
          else {
            local_148 = local_108._M_dataplus._M_p;
            puVar2 = (pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_e8 = CH(((Header *)&pOVar21->range)->cyl,((Header *)&pOVar21->range)->head);
            Message<char_const*,unsigned_char_const&,char_const*>
                      (msgWarning,"invalid %s checksum [%02X] on %s",&local_148,puVar2 + 0x1800,
                       &local_e8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    else if (uVar15 == 0) {
      puVar2 = (pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = *(int *)&(pDVar9->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (int)puVar2;
      if ((iVar5 < 0x1802) || (puVar2[0x1800] == puVar2[0x1801])) {
        if ((0x1800 < iVar5) && (puVar2[0x1800] != '\0')) {
          local_108._M_dataplus._M_p =
               CH(((Header *)&pOVar21->range)->cyl,((Header *)&pOVar21->range)->head);
          Message<unsigned_char_const&,char_const*>
                    (msgWarning,"unknown or invalid 6K checksum [%02X] on %s",puVar2 + 0x1800,
                     (char **)&local_108);
        }
      }
      else {
        local_108._M_dataplus._M_p =
             CH(((Header *)&pOVar21->range)->cyl,((Header *)&pOVar21->range)->head);
        Message<unsigned_char_const&,unsigned_char_const&,char_const*>
                  (msgWarning,"unknown or invalid 6K checksum [%02X %02X] on %s",puVar2 + 0x1800,
                   puVar2 + 0x1801,(char **)&local_108);
      }
    }
  }
  std::
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  ::~_Rb_tree((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
               *)local_138);
  std::
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  ::~_Rb_tree((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
               *)local_188);
  pthread_mutex_unlock((pthread_mutex_t *)&NormaliseTrack::map_mutex);
  return bVar4;
}

Assistant:

bool NormaliseTrack(const CylHead& cylhead, Track& track)
{
    bool changed = false;
    int i;

    // Clear the track length if offsets are disabled (cosmetic: no changed flag).
    if (opt.offsets == 0)
        track.tracklen = 0;

    // Pass 1
    for (i = 0; i < track.size(); ++i)
    {
        auto& sector = track[i];

        // Remove sectors with duplicate CHRN?
        if (opt.nodups)
        {
            // Remove duplicates found later on the track.
            for (int j = i + 1; j < track.size(); ++j)
            {
                auto& s = track[j];
                if (s.header.compare_chrn(sector.header) && s.encoding == sector.encoding)
                {
                    track.remove(j--);
                    changed = true;
                }
            }
        }

        // Clear all data, for privacy during diagnostics?
        if (opt.nodata && sector.has_data())
        {
            sector.remove_data();
            sector.add(Data());     // empty data rather than no data
            changed = true;
        }

        // Track offsets disabled? (cosmetic: no changed flag)
        if (opt.offsets == 0)
            sector.offset = 0;
#if 0
        // ToDo: move this to fdrawcmd disk type
        // Build ASRock corruption check block
        if (i < (int)arraysize(ah))
        {
            ah[i].cyl = sector.header.cyl;
            ah[i].head = sector.header.head;
            ah[i].sector = sector.header.sector;
            ah[i].size = sector.header.size;
        }
#endif

        if (sector.has_gapdata())
        {
            // Remove gap data if disabled, or the gap mask doesn't allow it
            if (opt.gaps == GAPS_NONE || !(opt.gapmask & (1 << i)))
            {
                sector.remove_gapdata();
                changed = true;
            }
            // Remove normal gaps unless we're asked to keep them.
            else if (opt.gaps == GAPS_CLEAN && sector.encoding == Encoding::MFM)
            {
                int gap3 = 0;
                if (test_remove_gap3(sector.data_copy(), sector.size(), gap3))
                {
                    sector.remove_gapdata(true);
                    changed = true;

                    if (!sector.gap3)
                        sector.gap3 = gap3;
                }
            }
        }
#if 0
        // ToDo: move this to affected disk types
        // Check for short sector wrapping the track end (includes logoprof.dmk and Les Justiciers 2 [1B].scp [CPC])
        // Also check it doesn't trigger in cyl 18 sector 5 of Super Sprint (KryoFlux).
        if (ps->uData > 0 && tracklen > 0 && ps->offset > 0 &&
            ps->uData < uSize &&
            GetDataExtent(i) > uSize &&
            (ps->offset + GetSectorOverhead(encrate) + uSize) > tracklen)
        {
            Message(msgWarning, "%s truncated at end of track data", CHSR(cyl, head, i, ps->sector));
        }
#endif
    }

    // Pass 2
    for (i = 0; i < track.size(); ++i)
    {
        Sector& sector = track[i];

        // Remove only the final gap if --no-gap4b was used
        if (i == (track.size() - 1) && opt.gap4b == 0 && sector.has_gapdata())
        {
            sector.remove_gapdata(true);
            changed = true;
        }

        // Allow override for sector datarate.
        if (opt.datarate != DataRate::Unknown)
        {
            sector.datarate = opt.datarate;
            changed = true;
        }

        // Allow override for sector encoding.
        if (opt.encoding != Encoding::Unknown)
        {
            sector.encoding = opt.encoding;
            changed = true;
        }

        // Allow overrides for track gap3 (cosmetic: no changed flag)
        if (opt.gap3 != -1)
            sector.gap3 = static_cast<uint8_t>(opt.gap3);
#if 0
        // ToDo: move this to fdrawcmd disk type
        // Check for the ASRock FDC problem that corrupts sector data with format headers (unless comparison block is all one byte)
        int nn = sizeof(ah) - sizeof(ah[0]) - 1;
        if (sectors > 1 && ps->apbData[0] && memcmp(ps->apbData[0], ps->apbData[0] + 1, sizeof(ah) - 1))
        {
            // Ignore the first sector and size in case of a placeholder sector
            if (!memcmp(&ah[1], ps->apbData[0] + sizeof(ah[0]), sizeof(ah) - sizeof(ah[0])))
                Message(msgWarning, "possible FDC data corruption on %s", CHSR(cyl, head, i, ps->sector));
        }
#endif
    }

    int weak_offset, weak_size;

    // Check for Speedlock weak sector (either +3 or CPC)
    if (opt.fix != 0 && cylhead.cyl == 0 && track.size() == 9)
    {
        auto& sector1 = track[1];
        if (sector1.copies() == 1 && IsSpectrumSpeedlockTrack(track, weak_offset, weak_size))
        {
            // Are we to add the missing weak sector?
            if (opt.fix == 1)
            {
                // Add a copy with differences matching the typical weak sector
                auto data = sector1.data_copy();
                for (i = weak_offset; i < data.size(); ++i)
                    data[i] = ~data[i];
                sector1.add(std::move(data), true);

                Message(msgFix, "added suitable second copy of +3 Speedlock weak sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing multiple copies of +3 Speedlock weak sector");
        }

        auto& sector7 = track[7];
        if (sector7.copies() == 1 && IsCpcSpeedlockTrack(track, weak_offset, weak_size))
        {
            // Are we to add the missing weak sector?
            if (opt.fix == 1)
            {
                // Add a second data copy with differences matching the typical weak sector
                auto data = sector7.data_copy();
                for (i = weak_offset; i < data.size(); ++i)
                    data[i] = ~data[i];
                sector7.add(std::move(data), true);

                Message(msgFix, "added suitable second copy of CPC Speedlock weak sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing multiple copies of CPC Speedlock weak sector");
        }
    }

    // Check for Rainbow Arts weak sector missing copies
    if (opt.fix != 0 && cylhead.cyl == 40 && track.size() == 9)
    {
        auto& sector1 = track[1];
        if (sector1.copies() == 1 && IsRainbowArtsTrack(track, weak_offset, weak_size))
        {
            // Are we to add the missing weak sector?
            if (opt.fix == 1)
            {
                // Ensure the weak sector has a data CRC error, to fix broken CPCDiskXP images
                if (!sector1.has_baddatacrc())
                {
                    auto data = sector1.data_copy();
                    sector1.remove_data();
                    sector1.add(std::move(data), true);
                    if (opt.debug) util::cout << "added missing data CRC error to Rainbow Arts track\n";
                }

                // Add a second data copy with differences matching the typical weak sector
                auto data = sector1.data_copy();
                for (i = weak_offset; i < data.size(); ++i)
                    data[i] = ~data[i];
                sector1.add(std::move(data), true);

                Message(msgFix, "added suitable second copy of Rainbow Arts weak sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing multiple copies of Rainbow Arts weak sector");
        }
    }

    // Check for missing OperaSoft 32K sector (CPDRead dumps).
    if (opt.fix != 0 && cylhead.cyl == 40 && track.size() == 9)
    {
        auto& sector7 = track[7];
        auto& sector8 = track[8];
        if (sector7.has_data() && sector8.data_size() == 0 && IsOperaSoftTrack(track))
        {
            if (opt.fix == 1)
            {
                const auto& data7 = sector7.data_copy();

                // Add 0x55 data and correct CRC for 256 bytes
                auto data8{ Data(256, 0x55) };
                data8.push_back(0xe8);
                data8.push_back(0x9f);

                // Fill up to the protection check with gap filler
                auto fill8{ Data(0x512 - data8.size(), 0x4e) };
                data8.insert(data8.end(), fill8.begin(), fill8.end());

                // Append sector 7 data to offset 0x512 to pass the protection check.
                data8.insert(data8.end(), data7.begin(), data7.end());

                // Replace any existing sector 8 data with out hand-crafted version.
                sector8.remove_data();
                sector8.add(std::move(data8), true);

                Message(msgFix, "added missing data to OperaSoft 32K sector");
                changed = true;
            }
            else
                Message(msgWarning, "missing data in OperaSoft 32K sector");
        }
    }

    // Check for Prehistorik track followed by unused KBI-19 sectors (mastering error?).
    if (opt.fix != 0 && track.size() == 13)
    {
        if (track[6].header.sector == 12 && IsPrehistorikTrack(track))
        {
            if (opt.fix == 1)
            {
                // Trim the unwanted sectors.
                while (track.size() > 7)
                {
                    track.remove(7);
                    changed = true;
                }

                Message(msgFix, "removed unused KBI-19 sectors from end of Prehistorik track");
                changed = true;
            }
            else
                Message(msgWarning, "6 junk KBI-19 sectors found (use --fix to remove)");
        }
    }

    // Check for the problematic Reussir protection (CPC).
    if (opt.fix != 0 && track.size() == 10)
    {
        for (auto& s : track)
        {
            if (s.size() != 512 || !s.has_good_data())
                continue;

            auto& data = s.data_copy();
            if (std::memcmp(data.data(), "\0LANCE", 6))
                continue;

            // LD A,(IX+0); CP (HL); JR NZ,e
            static const uint8_t prot_check[]{ 0xdd, 0x7e, 0x00, 0xbe, 0x20 };

            for (i = 0; i < data.size() - static_cast<int>(sizeof(prot_check)); ++i)
            {
                if (data[i] == 0xdd && !memcmp(data.data() + i, prot_check, sizeof(prot_check)))
                {
                    // Are we to fix (disable) the protection?
                    if (opt.fix == 1)
                    {
                        data[i + 3] = 0xaf; // XOR A
                        Message(msgFix, "disabled problematic Reussir protection");
                    }
                    else
                        Message(msgWarning, "detected problematic Reussir protection (use --fix to disable)");
                    break;
                }
            }
        }
    }

    // Single copy of an 8K sector?
    if (opt.check8k != 0 && track.is_8k_sector() && track[0].copies() == 1 && track[0].data_size() >= 0x1801)
    {
        const auto& sector = track[0];
        const auto& data = sector.data_copy();

        static std::mutex map_mutex;
        std::lock_guard<std::mutex> lock(map_mutex);

        // The checksum method can change within a disk, but usually corresponds
        // to a change in sector id or DAM type. Fun Radio [2B] (CPC) does this.
        auto key = std::make_pair(sector.header.sector, sector.dam);
        static std::map<decltype(key), std::set<ChecksumType>> methods_map;
        auto& disk_methods = methods_map[key];

        // Determine the potential 8K checksum methods, if any.
        auto sector_methods = ChecksumMethods(data.data(), data.size());

        if (disk_methods.empty())
        {
            // First of key type follows first sector, or None.
            if (!sector_methods.empty())
                disk_methods = sector_methods;
            else
                disk_methods = { ChecksumType::None };
        }

        // Determine which common methods between disk and sector.
        std::set<ChecksumType> common_methods{};
        std::set_intersection(
            sector_methods.begin(), sector_methods.end(),
            disk_methods.begin(), disk_methods.end(),
            std::inserter(common_methods, common_methods.begin()));

        if (sector_methods.find(ChecksumType::None) != sector_methods.end())
        {
            // If None is an option, there's no checksum.
        }
        else if (common_methods.size() == 1)
        {
            // A single match means a good sector, so have the disk follow it.
            if (disk_methods.size() > 1)
                disk_methods = common_methods;
        }
        else if (disk_methods.empty())
        {
            // Unrecognised 8K method, probably the first on track containing one.
            // Ignore two matching bytes, or a single zero, as likely junk.
            if (data.size() >= 0x1802 && (data[0x1800] != data[0x1801]))
            {
                Message(msgWarning, "unknown or invalid 6K checksum [%02X %02X] on %s",
                    data[0x1800], data[0x1801], CH(cylhead.cyl, cylhead.head));
            }
            else if (data.size() >= 0x1801 && data[0x1800])
            {
                Message(msgWarning, "unknown or invalid 6K checksum [%02X] on %s",
                    data[0x1800], CH(cylhead.cyl, cylhead.head));
            }
        }
        else if (disk_methods.size() == 1 && common_methods.empty() &&
            disk_methods.find(ChecksumType::None) == disk_methods.end())
        {
            // The disk has a method, which the sector lacks. Probably bad.
            auto str_method = ChecksumName(disk_methods);
            auto checksum_len = ChecksumLength(*disk_methods.begin());

            if (checksum_len == 1 || data.size() < 0x1802)
            {
                Message(msgWarning, "invalid %s checksum [%02X] on %s",
                    str_method.c_str(), data[0x1800], CH(cylhead.cyl, cylhead.head));
            }
            else if (checksum_len == 2)
            {
                Message(msgWarning, "invalid %s checksum [%02X %02X] on %s",
                    str_method.c_str(), data[0x1800], data[0x1801],
                    CH(cylhead.cyl, cylhead.head));
            }
        }
    }

    // Return whether the supplied track was modified.
    return changed;
}